

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O0

void __thiscall
cnn::Model::save<boost::archive::text_oarchive>(Model *this,text_oarchive *ar,uint param_3)

{
  size_type sVar1;
  interface_oarchive<boost::archive::text_oarchive> *in_RSI;
  long in_RDI;
  uint i_1;
  uint i;
  int nlp;
  int np;
  Parameters *in_stack_ffffffffffffffa8;
  interface_oarchive<boost::archive::text_oarchive> *in_stack_ffffffffffffffb0;
  interface_oarchive<boost::archive::text_oarchive> *this_00;
  undefined4 local_24;
  undefined4 local_20;
  
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size
            ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)(in_RDI + 0x18));
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::size
            ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
             (in_RDI + 0x30));
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_stack_ffffffffffffffb0,(int *)in_stack_ffffffffffffffa8);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size
                      ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                       (in_RDI + 0x18));
    if (sVar1 <= local_20) break;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)(in_RDI + 0x18),
               (ulong)local_20);
    boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::size
                      ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                       (in_RDI + 0x30));
    if (sVar1 <= local_24) break;
    this_00 = in_RSI;
    std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::operator[]
              ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
               (in_RDI + 0x30),(ulong)local_24);
    boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
              (this_00,(LookupParameters *)in_stack_ffffffffffffffa8);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    int np = params.size();
    int nlp = lookup_params.size();
    ar & np;
    ar & nlp;
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
  }